

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  int iVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint newasize;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  Counters local_bc;
  
  if ((value->tt_ & 0xf) != 0) {
    iVar4 = insertkey(t,key,value);
    if (iVar4 == 0) {
      iVar4 = 0;
      memset(&local_bc.na,0,0x88);
      local_bc.total = 1;
      if (key->tt_ == '\x03') {
        countint((key->value_).i,&local_bc);
      }
      lVar11 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) * 0x18 + 0x10;
      do {
        pNVar2 = t->node;
        if ((*(byte *)((long)pNVar2 + lVar11 + -8) & 0xf) == 0) {
          local_bc.deleted = 1;
        }
        else {
          iVar4 = iVar4 + 1;
          if (*(char *)((long)pNVar2 + lVar11 + -7) == '\x03') {
            countint(*(lua_Integer *)((long)pNVar2 + lVar11),&local_bc);
          }
        }
        lVar11 = lVar11 + -0x18;
      } while (lVar11 != -8);
      local_bc.total = iVar4 + local_bc.total;
      newasize = t->asize;
      if (local_bc.na != 0) {
        lVar11 = 0;
        uVar5 = 1;
        iVar4 = 0;
        uVar6 = 1;
        do {
          uVar8 = uVar6;
          if ((newasize < uVar6) && (uVar8 = newasize, newasize < uVar5)) {
            bVar3 = false;
          }
          else {
            iVar10 = 0;
            uVar7 = uVar5;
            if (uVar5 <= uVar8) {
              uVar7 = uVar8 + 1;
              if (uVar8 + 1 < uVar5 + 1) {
                uVar7 = uVar5 + 1;
              }
              uVar5 = uVar5 - 1;
              iVar10 = 0;
              do {
                iVar10 = (iVar10 + 1) -
                         (uint)((*(byte *)((long)t->array + (ulong)uVar5 + 4) & 0xf) == 0);
                iVar1 = uVar5 - uVar7;
                uVar5 = uVar5 + 1;
              } while (iVar1 != -2);
            }
            local_bc.nums[lVar11] = local_bc.nums[lVar11] + iVar10;
            iVar4 = iVar4 + iVar10;
            bVar3 = true;
            uVar5 = uVar7;
          }
          if (!bVar3) break;
          lVar11 = lVar11 + 1;
          uVar6 = uVar6 * 2;
        } while (lVar11 != 0x20);
        local_bc.total = local_bc.total + iVar4;
        uVar5 = local_bc.na + iVar4;
        uVar6 = 1;
        lVar11 = 0;
        newasize = 0;
        local_bc.na = 0;
        uVar9 = 0;
        do {
          if ((ulong)uVar5 * 3 < (ulong)uVar6) break;
          uVar8 = (int)uVar9 + local_bc.nums[lVar11];
          uVar9 = (ulong)uVar8;
          if ((ulong)uVar6 <= uVar9 * 3 && local_bc.nums[lVar11] != 0) {
            newasize = uVar6;
            local_bc.na = uVar8;
          }
          lVar11 = lVar11 + 1;
          uVar6 = uVar6 * 2;
        } while (lVar11 != 0x20);
      }
      uVar6 = local_bc.total - local_bc.na >> 2;
      if (local_bc.deleted == 0) {
        uVar6 = 0;
      }
      luaH_resize(L,t,newasize,uVar6 + (local_bc.total - local_bc.na));
      newcheckedkey(t,key,value);
    }
    if ((((key->tt_ & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
       ((((key->value_).gc)->marked & 0x18) != 0)) {
      luaC_barrierback_(L,(GCObject *)t);
      return;
    }
  }
  return;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  if (!ttisnil(value)) {  /* do not insert nil values */
    int done = insertkey(t, key, value);
    if (!done) {  /* could not find a free place? */
      rehash(L, t, key);  /* grow table */
      newcheckedkey(t, key, value);  /* insert key in grown table */
    }
    luaC_barrierback(L, obj2gco(t), key);
    /* for debugging only: any new key may force an emergency collection */
    condchangemem(L, (void)0, (void)0, 1);
  }
}